

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt32 tt_cmap6_char_next(TT_CMap cmap,FT_UInt32 *pchar_code)

{
  FT_Byte *pFVar1;
  uint local_4c;
  FT_UInt idx;
  FT_UInt count;
  FT_UInt start;
  FT_Byte *p;
  uint local_30;
  FT_UInt gindex;
  FT_UInt32 char_code;
  FT_UInt32 result;
  FT_Byte *table;
  FT_UInt32 *pchar_code_local;
  TT_CMap cmap_local;
  
  pFVar1 = cmap->data;
  gindex = 0;
  local_30 = *pchar_code + 1;
  p._4_4_ = 0;
  local_4c = (uint)CONCAT11(pFVar1[6],pFVar1[7]);
  if (local_30 < 0x10000) {
    if (local_30 < local_4c) {
      local_30 = local_4c;
    }
    local_4c = local_30 - local_4c;
    _count = pFVar1 + (ulong)(local_4c * 2) + 10;
    for (; local_4c < CONCAT11(pFVar1[8],pFVar1[9]); local_4c = local_4c + 1) {
      p._4_4_ = (uint)CONCAT11(*_count,_count[1]);
      if (p._4_4_ != 0) {
        gindex = local_30;
        break;
      }
      if (0xfffe < local_30) {
        return 0;
      }
      local_30 = local_30 + 1;
      _count = _count + 2;
    }
    *pchar_code = gindex;
    cmap_local._4_4_ = p._4_4_;
  }
  else {
    cmap_local._4_4_ = 0;
  }
  return cmap_local._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap6_char_next( TT_CMap     cmap,
                      FT_UInt32  *pchar_code )
  {
    FT_Byte*   table     = cmap->data;
    FT_UInt32  result    = 0;
    FT_UInt32  char_code = *pchar_code + 1;
    FT_UInt    gindex    = 0;

    FT_Byte*   p         = table + 6;
    FT_UInt    start     = TT_NEXT_USHORT( p );
    FT_UInt    count     = TT_NEXT_USHORT( p );
    FT_UInt    idx;


    if ( char_code >= 0x10000UL )
      return 0;

    if ( char_code < start )
      char_code = start;

    idx = (FT_UInt)( char_code - start );
    p  += 2 * idx;

    for ( ; idx < count; idx++ )
    {
      gindex = TT_NEXT_USHORT( p );
      if ( gindex != 0 )
      {
        result = char_code;
        break;
      }

      if ( char_code >= 0xFFFFU )
        return 0;

      char_code++;
    }

    *pchar_code = result;
    return gindex;
  }